

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# n2builder.cpp
# Opt level: O2

void __thiscall
icu_63::Normalizer2DataBuilder::writeCSourceFile(Normalizer2DataBuilder *this,char *filename)

{
  UErrorCode *errorCode_00;
  short sVar1;
  char *str;
  char *pcVar2;
  FILE *__stream;
  char16_t *p;
  __off_t __length;
  int32_t length;
  StringPiece s;
  LocalUCPTriePointer norm16Trie;
  IcuToolErrorCode errorCode;
  undefined1 local_118 [12];
  CharString dataName;
  CharString path;
  char line [100];
  
  processData((Normalizer2DataBuilder *)&norm16Trie);
  errorCode.super_ErrorCode.errorCode = U_ZERO_ERROR;
  errorCode.super_ErrorCode._vptr_ErrorCode = (_func_int **)&PTR__IcuToolErrorCode_0039ffb8;
  errorCode.location = "gennorm2/writeCSourceFile()";
  str = findBasename(filename);
  errorCode_00 = &errorCode.super_ErrorCode.errorCode;
  CharString::CharString(&path,filename,(int)str - (int)filename,errorCode_00);
  StringPiece::StringPiece((StringPiece *)local_118,str);
  s._12_4_ = 0;
  s.ptr_ = (char *)local_118._0_8_;
  s.length_ = local_118._8_4_;
  CharString::CharString(&dataName,s,errorCode_00);
  pcVar2 = strrchr(str,0x2e);
  if (pcVar2 != (char *)0x0) {
    CharString::truncate(&dataName,(char *)(ulong)(uint)((int)pcVar2 - (int)str),__length);
  }
  ErrorCode::assertSuccess(&errorCode.super_ErrorCode);
  __stream = (FILE *)usrc_create(path.buffer.ptr,str,0x7e0,"icu/source/tools/gennorm2/n2builder.cpp"
                                );
  if (__stream != (FILE *)0x0) {
    fputs("#ifdef INCLUDED_FROM_NORMALIZER2_CPP\n\n",__stream);
    sprintf(line,"static const UVersionInfo %s_formatVersion={",dataName.buffer.ptr);
    usrc_writeArray((FILE *)__stream,line,::dataInfo.formatVersion,8,4,"};\n");
    sprintf(line,"static const UVersionInfo %s_dataVersion={",dataName.buffer.ptr);
    usrc_writeArray((FILE *)__stream,line,::dataInfo.dataVersion,8,4,"};\n\n");
    sprintf(line,"static const int32_t %s_indexes[Normalizer2Impl::IX_COUNT]={\n",
            dataName.buffer.ptr);
    usrc_writeArray((FILE *)__stream,line,this->indexes,0x20,0x14,"\n};\n\n");
    usrc_writeUCPTrie((FILE *)__stream,dataName.buffer.ptr,
                      (UCPTrie *)norm16Trie.super_LocalPointerBase<UCPTrie>.ptr);
    sprintf(line,"static const uint16_t %s_extraData[%%ld]={\n",dataName.buffer.ptr);
    p = UnicodeString::getBuffer(&this->extraData);
    sVar1 = (this->extraData).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      length = (this->extraData).fUnion.fFields.fLength;
    }
    else {
      length = (int)sVar1 >> 5;
    }
    usrc_writeArray((FILE *)__stream,line,p,0x10,length,"\n};\n\n");
    sprintf(line,"static const uint8_t %s_smallFCD[%%ld]={\n",dataName.buffer.ptr);
    usrc_writeArray((FILE *)__stream,line,this->smallFCD,8,0x100,"\n};\n\n");
    fputs("#endif  // INCLUDED_FROM_NORMALIZER2_CPP\n",__stream);
    fclose(__stream);
    MaybeStackArray<char,_40>::~MaybeStackArray(&dataName.buffer);
    MaybeStackArray<char,_40>::~MaybeStackArray(&path.buffer);
    IcuToolErrorCode::~IcuToolErrorCode(&errorCode);
    LocalUCPTriePointer::~LocalUCPTriePointer(&norm16Trie);
    return;
  }
  fprintf(_stderr,"gennorm2/writeCSourceFile() error: unable to create the output file %s\n",
          filename);
  exit(4);
}

Assistant:

void
Normalizer2DataBuilder::writeCSourceFile(const char *filename) {
    LocalUCPTriePointer norm16Trie = processData();

    IcuToolErrorCode errorCode("gennorm2/writeCSourceFile()");
    const char *basename=findBasename(filename);
    CharString path(filename, (int32_t)(basename-filename), errorCode);
    CharString dataName(basename, errorCode);
    const char *extension=strrchr(basename, '.');
    if(extension!=NULL) {
        dataName.truncate((int32_t)(extension-basename));
    }
    const char *name=dataName.data();
    errorCode.assertSuccess();

    FILE *f=usrc_create(path.data(), basename, 2016, "icu/source/tools/gennorm2/n2builder.cpp");
    if(f==NULL) {
        fprintf(stderr, "gennorm2/writeCSourceFile() error: unable to create the output file %s\n",
                filename);
        exit(U_FILE_ACCESS_ERROR);
    }
    fputs("#ifdef INCLUDED_FROM_NORMALIZER2_CPP\n\n", f);

    char line[100];
    sprintf(line, "static const UVersionInfo %s_formatVersion={", name);
    usrc_writeArray(f, line, dataInfo.formatVersion, 8, 4, "};\n");
    sprintf(line, "static const UVersionInfo %s_dataVersion={", name);
    usrc_writeArray(f, line, dataInfo.dataVersion, 8, 4, "};\n\n");
    sprintf(line, "static const int32_t %s_indexes[Normalizer2Impl::IX_COUNT]={\n", name);
    usrc_writeArray(f, line, indexes, 32, Normalizer2Impl::IX_COUNT, "\n};\n\n");

    usrc_writeUCPTrie(f, name, norm16Trie.getAlias());

    sprintf(line, "static const uint16_t %s_extraData[%%ld]={\n", name);
    usrc_writeArray(f, line, extraData.getBuffer(), 16, extraData.length(), "\n};\n\n");
    sprintf(line, "static const uint8_t %s_smallFCD[%%ld]={\n", name);
    usrc_writeArray(f, line, smallFCD, 8, sizeof(smallFCD), "\n};\n\n");

    fputs("#endif  // INCLUDED_FROM_NORMALIZER2_CPP\n", f);
    fclose(f);
}